

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O0

void borg_update_kill_new(wchar_t i)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  monster_conflict *pmVar4;
  chunk_conflict *c;
  monster_race *pmVar5;
  _Bool _Var6;
  int iVar7;
  int iVar8;
  int iVar9;
  borg_kill *pbVar10;
  loc_conflict grid;
  monster *pmVar11;
  int local_4c;
  monster_race *r_ptr;
  monster_conflict *m_ptr;
  borg_kill *kill;
  int local_18;
  wchar_t pct;
  wchar_t num;
  wchar_t j;
  wchar_t k;
  wchar_t i_local;
  
  pmVar5 = r_info;
  local_18 = 0;
  pbVar10 = borg_kills + i;
  pmVar4 = cave->monsters;
  sVar1 = pbVar10->m_idx;
  uVar2 = pbVar10->r_idx;
  pbVar10->speed = pmVar4[sVar1].mspeed;
  if (pmVar4[sVar1].maxhp == 0) {
    kill._4_4_ = 100;
  }
  else {
    if (pmVar4[sVar1].maxhp < 2) {
      local_4c = 1;
    }
    else {
      local_4c = (int)pmVar4[sVar1].maxhp;
    }
    kill._4_4_ = (int)(((long)pmVar4[sVar1].hp * 100) / (long)local_4c);
  }
  pbVar10->power = (int16_t)((long)(pmVar4[sVar1].maxhp * kill._4_4_) / 100);
  pbVar10->injury = 100 - (short)kill._4_4_;
  pbVar10->level = (int16_t)pmVar5[uVar2].level;
  _Var6 = flag_has_dbg(pmVar5[uVar2].flags,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE");
  if (_Var6) {
    pbVar10->awake = true;
  }
  c = cave;
  grid = (loc_conflict)loc((pbVar10->pos).x,(pbVar10->pos).y);
  pmVar11 = square_monster((chunk *)c,grid);
  pbVar10->m_idx = (int16_t)pmVar11->midx;
  if (pmVar4[sVar1].m_timed[0] == 0) {
    pbVar10->awake = true;
  }
  else {
    pbVar10->awake = false;
  }
  if (pmVar4[sVar1].m_timed[3] == 0) {
    pbVar10->afraid = false;
  }
  else {
    pbVar10->afraid = true;
  }
  if (pmVar4[sVar1].m_timed[2] == 0) {
    pbVar10->confused = false;
  }
  else {
    pbVar10->confused = true;
  }
  if (pmVar4[sVar1].m_timed[1] == 0) {
    pbVar10->stunned = false;
  }
  else {
    pbVar10->stunned = true;
  }
  pbVar10->spell_flags[0] = (uint)pmVar5[uVar2].spell_flags[0];
  pbVar10->spell_flags[1] = (uint)pmVar5[uVar2].spell_flags[1];
  pbVar10->spell_flags[2] = (uint)pmVar5[uVar2].spell_flags[2];
  for (num = L'\x01'; num < L'\\'; num = num + L'\x01') {
    _Var6 = flag_has_dbg(pmVar5[uVar2].spell_flags,0xc,num,"r_ptr->spell_flags","k");
    if (_Var6) {
      pbVar10->spell[local_18] = (uint8_t)num;
      local_18 = local_18 + 1;
    }
  }
  pbVar10->ranged_attack = (uint8_t)local_18;
  if (pbVar10->r_idx == borg_morgoth_id) {
    iVar3 = (pbVar10->pos).y;
    iVar7 = borg_panel_hgt();
    iVar8 = borg_panel_hgt();
    iVar9 = borg_panel_hgt();
    pct = ((iVar3 - iVar7 / 2) / iVar8) * iVar9;
    if (pct < L'\0') {
      pct = L'\0';
    }
    if (L'B' - ((Term->hgt - row_top_map[Term->sidebar_mode]) - row_bottom_map[Term->sidebar_mode])
               / (int)(uint)tile_height < pct) {
      pct = L'B' - ((Term->hgt - row_top_map[Term->sidebar_mode]) -
                   row_bottom_map[Term->sidebar_mode]) / (int)(uint)tile_height;
    }
    morgy_panel_y = pct;
    iVar3 = (pbVar10->pos).x;
    iVar7 = borg_panel_wid();
    iVar8 = borg_panel_wid();
    iVar9 = borg_panel_wid();
    pct = ((iVar3 - iVar7 / 2) / iVar8) * iVar9;
    if (pct < L'\0') {
      pct = L'\0';
    }
    if (L'Æ' - ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width < pct) {
      pct = L'Æ' - ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width;
    }
    morgy_panel_x = pct;
  }
  _Var6 = flag_has_dbg(pmVar5[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
  if (!_Var6) {
    borg_grids[(pbVar10->pos).y][(pbVar10->pos).x].feat = '\x01';
  }
  if ((borg_grids[(pbVar10->pos).y][(pbVar10->pos).x].feat != '\x01') &&
     (_Var6 = flag_has_dbg(pmVar5[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL"), _Var6)) {
    borg_grids[(pbVar10->pos).y][(pbVar10->pos).x].feat = '\x15';
  }
  return;
}

Assistant:

static void borg_update_kill_new(int i)
{
    int k   = 0;
    int j   = 0;
    int num = 0;
    int pct;

    borg_kill *kill            = &borg_kills[i];

    struct monster      *m_ptr = &cave->monsters[kill->m_idx];
    struct monster_race *r_ptr = &r_info[kill->r_idx];

    /* Extract the monster speed */
    kill->speed = (m_ptr->mspeed);

    /* Extract max hitpoints */
    /* This is a cheat.  Borg does not look
     * at the bar at the bottom and frankly that would take a lot of code.
     * It would involve targeting every monster to read their individual bar.
     * then keeping track of it.  When the borg has telepathy this would
     * cripple him down and be tremendously slow.
     *
     * This cheat is not too bad.  A human could draw the same info from
     * from the screen.
     *
     * Basically the borg is cheating the real hit points of the monster then
     * using that information to calculate the estimated hp of the monster.
     * Its the same basic tactic that we would use.
     *
     * Kill->power is used a lot in borg_danger,
     * for calculating damage from breath attacks.
     */
    if (m_ptr->maxhp) {
        /* Cheat the "percent" of health */
        pct = 100L * m_ptr->hp / ((m_ptr->maxhp > 1) ? m_ptr->maxhp : 1);
    } else {
        pct = 100;
    }

    /* Compute estimated HP based on number of * in monster health bar */
    kill->power  = (m_ptr->maxhp * pct) / 100;
    kill->injury = 100 - pct;

    /* Extract the Level*/
    kill->level = r_ptr->level;

    /* Some monsters never move */
    if (rf_has(r_ptr->flags, RF_NEVER_MOVE))
        kill->awake = true;

    /* Cheat in the game's index of the monster.
     * Used in tracking monsters
     */
    kill->m_idx = square_monster(cave, loc(kill->pos.x, kill->pos.y))->midx;

    /* Is it sleeping */
    if (m_ptr->m_timed[MON_TMD_SLEEP] == 0)
        kill->awake = true;
    else
        kill->awake = false;

    /* Is it afraid */
    if (m_ptr->m_timed[MON_TMD_FEAR] == 0)
        kill->afraid = false;
    else
        kill->afraid = true;

    /* Is it confused */
    if (m_ptr->m_timed[MON_TMD_CONF] == 0)
        kill->confused = false;
    else
        kill->confused = true;

    /* Is it stunned*/
    if (m_ptr->m_timed[MON_TMD_STUN] == 0)
        kill->stunned = false;
    else
        kill->stunned = true;

    /* Preload the spells from the race into this individual monster */
    kill->spell_flags[0] = r_ptr->spell_flags[0];
    kill->spell_flags[1] = r_ptr->spell_flags[1];
    kill->spell_flags[2] = r_ptr->spell_flags[2];

    /* Extract the spells */
    for (k = RSF_NONE + 1; k < RSF_MAX; k++) {
        if (rsf_has(r_ptr->spell_flags, k))
            kill->spell[num++] = k;
    }

    /* Store the number of ranged attacks */
    kill->ranged_attack = num;

    /* We want to remember Morgy's panel */
    if (kill->r_idx == borg_morgoth_id) {
        j = ((kill->pos.y - borg_panel_hgt() / 2) / borg_panel_hgt())
            * borg_panel_hgt();
        if (j < 0)
            j = 0;
        if (j > DUNGEON_HGT - SCREEN_HGT)
            j = DUNGEON_HGT - SCREEN_HGT;
        morgy_panel_y = j;

        j = ((kill->pos.x - borg_panel_wid() / 2) / borg_panel_wid())
            * borg_panel_wid();
        if (j < 0)
            j = 0;
        if (j > DUNGEON_WID - SCREEN_WID)
            j = DUNGEON_WID - SCREEN_WID;
        morgy_panel_x = j;
    }

    /* Hack -- Force the monster to be sitting on a floor
     * grid unless that monster can pass through walls
     */
    if (!rf_has(r_ptr->flags, RF_PASS_WALL)) {
        borg_grids[kill->pos.y][kill->pos.x].feat = FEAT_FLOOR;
    }

    /* Hack -- Force the ghostly monster to be in a wall
     * grid until the grid is proven to be something else
     */
    if (borg_grids[kill->pos.y][kill->pos.x].feat != FEAT_FLOOR
        && rf_has(r_ptr->flags, RF_PASS_WALL)) {
        borg_grids[kill->pos.y][kill->pos.x].feat = FEAT_GRANITE;
    }
}